

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O2

PCAPNG_RESULT
pcapng_create(PCAPNG_HANDLE *handle,char *filename,option_header *section_options,
             size_t section_options_space,uint16_t link_type,uint32_t snaplen,
             option_header *interface_options,size_t interface_options_space)

{
  ushort uVar1;
  int iVar2;
  int __fd;
  ssize_t sVar3;
  section_header_block *psVar4;
  interface_description_block *piVar5;
  uint32_t uVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  PCAPNG_RESULT PVar10;
  ulong uVar11;
  size_t sVar12;
  bool bVar13;
  undefined8 local_70;
  interface_description_block idb;
  
  iVar2 = getpagesize();
  handle->section_header = (section_header_block *)0x0;
  handle->section_header_size = 0;
  handle->next_section_option_offset = 0;
  handle->interface_description = (interface_description_block *)0x0;
  handle->interface_description_size = 0;
  handle->next_interface_option_offset = 0;
  __fd = open(filename,0xc2,0x1b0);
  handle->fd = __fd;
  PVar10 = PCAPNG_FILE_WRITE_ERROR;
  if (__fd == -1) goto LAB_0010773b;
  handle->section_header_size = 0x18;
  idb._8_8_ = section_options_space;
  sVar3 = write(__fd,&DAT_0010c540,0x18);
  for (; (sVar3 != -1 && (section_options != (option_header *)0x0));
      section_options = (option_header *)((long)&section_options[1].option_code + uVar9)) {
    if (section_options->option_code == 0) {
LAB_00107568:
      sVar7 = handle->section_header_size;
      handle->next_section_option_offset = sVar7;
      goto LAB_00107584;
    }
    uVar1 = section_options->option_length;
    if (uVar1 == 0) goto LAB_00107568;
    uVar9 = (ulong)(uVar1 + 3 & 0xfffffffc);
    sVar3 = write(handle->fd,section_options,(ulong)uVar1 + 4);
    lVar8 = uVar1 - uVar9;
    while ((lVar8 != 0 && (sVar3 != -1))) {
      sVar3 = write(handle->fd,"",1);
      lVar8 = lVar8 + 1;
    }
    handle->section_header_size = handle->section_header_size + uVar9 + 4;
  }
  sVar7 = handle->section_header_size;
  handle->next_section_option_offset = sVar7;
  if (sVar3 != -1) {
LAB_00107584:
    uVar9 = (ulong)iVar2;
    uVar11 = sVar7 + idb._8_8_ + uVar9 + 3;
    sVar12 = uVar11 - uVar11 % uVar9;
    handle->section_header_size = sVar12;
    lVar8 = sVar12 - sVar7;
    while ((bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13 && (sVar3 != -1))) {
      sVar3 = write(handle->fd,"",1);
    }
    psVar4 = (section_header_block *)mmap((void *)0x0,handle->section_header_size,3,1,handle->fd,0);
    handle->section_header = psVar4;
    if (sVar3 != -1) {
      PVar10 = PCAPNG_MMAP_FAILED;
      if (psVar4 == (section_header_block *)0xffffffffffffffff) goto LAB_0010773b;
      local_70 = 1;
      idb.block_type._2_2_ = 0;
      handle->interface_description_size = 0x10;
      idb.block_type._0_2_ = link_type;
      idb.block_total_length = snaplen;
      sVar3 = write(handle->fd,&local_70,0x10);
      for (; (sVar3 != -1 && (interface_options != (option_header *)0x0));
          interface_options = (option_header *)((long)&interface_options[1].option_code + uVar11)) {
        if (interface_options->option_code == 0) {
LAB_001076d1:
          sVar7 = handle->interface_description_size;
          handle->next_interface_option_offset = sVar7;
          goto LAB_001076e9;
        }
        uVar1 = interface_options->option_length;
        if (uVar1 == 0) goto LAB_001076d1;
        uVar11 = (ulong)(uVar1 + 3 & 0xfffffffc);
        sVar3 = write(handle->fd,interface_options,(ulong)uVar1 + 4);
        lVar8 = uVar1 - uVar11;
        while ((lVar8 != 0 && (sVar3 != -1))) {
          sVar3 = write(handle->fd,"",1);
          lVar8 = lVar8 + 1;
        }
        handle->interface_description_size = handle->interface_description_size + uVar11 + 4;
      }
      sVar7 = handle->interface_description_size;
      handle->next_interface_option_offset = sVar7;
      if (sVar3 != -1) {
LAB_001076e9:
        uVar11 = sVar7 + interface_options_space + uVar9 + 3;
        sVar12 = uVar11 - uVar11 % uVar9;
        handle->interface_description_size = sVar12;
        lVar8 = sVar12 - sVar7;
        while ((bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13 && (sVar3 != -1))) {
          sVar3 = write(handle->fd,"",1);
        }
        piVar5 = (interface_description_block *)
                 mmap((void *)0x0,handle->interface_description_size,3,1,handle->fd,
                      handle->section_header_size);
        handle->interface_description = piVar5;
        PVar10 = PCAPNG_FILE_WRITE_ERROR;
        if ((sVar3 != -1) &&
           (PVar10 = PCAPNG_MMAP_FAILED, piVar5 != (interface_description_block *)0xffffffffffffffff
           )) {
          padopt.option_length =
               ((short)(int)handle->section_header_size - (short)handle->next_section_option_offset)
               - 0xc;
          *(option_header *)
           ((long)&handle->section_header->block_type + handle->next_section_option_offset) = padopt
          ;
          psVar4 = handle->section_header;
          uVar9 = handle->section_header_size;
          uVar6 = (uint32_t)uVar9;
          psVar4->block_total_length = uVar6;
          *(uint32_t *)((long)psVar4 + ((uVar9 & 0xfffffffffffffffc) - 4)) = uVar6;
          padopt.option_length =
               ((short)(int)handle->interface_description_size -
               (short)handle->next_interface_option_offset) - 0xc;
          *(option_header *)
           ((long)&handle->interface_description->block_type + handle->next_interface_option_offset)
               = padopt;
          piVar5 = handle->interface_description;
          uVar9 = handle->interface_description_size;
          piVar5->block_total_length = (uint32_t)uVar9;
          *(uint32_t *)((long)piVar5 + ((uVar9 & 0xfffffffffffffffc) - 4)) = (uint32_t)uVar9;
          handle->section_header->section_length = uVar9;
          return PCAPNG_OK;
        }
        goto LAB_0010773b;
      }
    }
  }
  PVar10 = PCAPNG_FILE_WRITE_ERROR;
LAB_0010773b:
  pcapng_close(handle);
  return PVar10;
}

Assistant:

PCAPNG_RESULT pcapng_create( PCAPNG_HANDLE * handle,
			     const char * filename,
			     const option_header * section_options,
			     const size_t section_options_space,
			     const uint16_t link_type,
			     const uint32_t snaplen,
			     const option_header * interface_options,
			     const size_t interface_options_space )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	int PGSZ = getpagesize( );
	size_t zeroes = 0, result = -1;

	handle->section_header = NULL;
	handle->interface_description = NULL;
	handle->section_header_size = handle->next_section_option_offset =
		handle->interface_description_size =
		handle->next_interface_option_offset = 0;

	handle->fd = open( filename, O_RDWR|O_CREAT|O_EXCL, S_IRUSR|S_IWUSR|S_IRGRP|S_IWGRP );
	if (handle->fd == -1) {
		switch( errno ) {
		case EEXIST:
			retval = PCAPNG_FILE_EXISTS;
			break;
		case EMFILE:
		case ENFILE:
			retval = PCAPNG_TOO_MANY_FILES_OPEN;
			break;
		case ENOMEM:
		case ENOSPC:
			retval = PCAPNG_NO_MEMORY;
			break;
		default:
			retval = PCAPNG_FILE_NOT_ALLOWED;
		}
	}

	if (retval == PCAPNG_OK) {
		/* section header */
		const section_header_block shb = {
			.block_type = BLOCK_TYPE_SECTION_HEADER,
			.block_total_length = 28,
			.byte_order_magic = SECTION_HEADER_BYTE_ORDER_MAGIC,
			.major_version = 1,
			.minor_version = 0,
			.section_length = (uint64_t) -1,
		};
		handle->section_header_size = sizeof( shb );
		result = write( handle->fd, &shb, sizeof( shb ) );
		/* write initial section options */
		while ((result != -1) &&
		       section_options &&
		       section_options->option_code &&
		       section_options->option_length) {
			size_t paddedsz = 4*((section_options->option_length+3)/4);
			zeroes = paddedsz - section_options->option_length;
			result = write( handle->fd, section_options, 4+section_options->option_length );
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}
			section_options = (const option_header *) &((uint8_t *)section_options)[4+paddedsz];
			handle->section_header_size += (4+paddedsz);
		}
		handle->next_section_option_offset = handle->section_header_size;
	}

	if (result == -1) {
		retval = PCAPNG_FILE_WRITE_ERROR;
	}
	else {
		/* determine the size of section header with desired space */
		zeroes = (size_t) PGSZ*((handle->section_header_size + 4 +
					 section_options_space + PGSZ - 1)/PGSZ) -
			handle->section_header_size;
		handle->section_header_size += zeroes;
		while ((zeroes > 0) && (result != -1)) {
			result = write( handle->fd, "\0", 1 );
			zeroes--;
		}

		/* mmap the section header */
		handle->section_header = mmap( NULL, handle->section_header_size, 
					       PROT_READ|PROT_WRITE,
					       MAP_SHARED,
					       handle->fd, 0 );
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->section_header == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			/* write the interface header */
			const interface_description_block idb = {
				.block_type = BLOCK_TYPE_INTERFACE,
				.block_total_length = 0,
				.link_type = link_type,
				.snaplen = snaplen
			};
			handle->interface_description_size = sizeof( idb );
			result = write( handle->fd, &idb, sizeof( idb ) );

			/* write interface options */
			while ((result != -1) &&
			       interface_options &&
			       interface_options->option_code &&
			       interface_options->option_length) {
				size_t paddedsz = 4*((interface_options->option_length+3)/4);
				zeroes = paddedsz - interface_options->option_length;
				result = write( handle->fd, interface_options, 4+interface_options->option_length );
				while ((zeroes > 0) && (result != -1)) {
					result = write( handle->fd, "\0", 1 );
					zeroes--;
				}
				interface_options = (const option_header *) &((uint8_t *)interface_options)[4+paddedsz];
				handle->interface_description_size += (4+paddedsz);
			}
			handle->next_interface_option_offset = handle->interface_description_size;
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else {
			/* determine the size of interface description with desired space */
			zeroes = (size_t) PGSZ*((handle->interface_description_size + 4 +
						 interface_options_space + PGSZ - 1)/PGSZ) -
				handle->interface_description_size;
			handle->interface_description_size += zeroes;
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}

			/* mmap the interface description */
			handle->interface_description = mmap( NULL, handle->interface_description_size, 
							      PROT_READ|PROT_WRITE,
							      MAP_SHARED,
							      handle->fd,
							      handle->section_header_size );
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->interface_description == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			uint8_t * dest = &((uint8_t *)handle->section_header)[handle->next_section_option_offset];
			padopt.option_length = handle->section_header_size -
				handle->next_section_option_offset - 12;

			/* Add padding options, update the header sizes. */
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->section_header->block_total_length =
				(uint32_t) handle->section_header_size;
			((uint32_t*)handle->section_header)[handle->section_header_size/4-1] =
				(uint32_t) handle->section_header_size;

			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->interface_description->block_total_length =
				(uint32_t) handle->interface_description_size;
			((uint32_t*)handle->interface_description)[handle->interface_description_size/4-1] =
				(uint32_t) handle->interface_description_size;

			handle->section_header->section_length = (uint64_t) handle->interface_description_size;
		}
	}

	if (retval != PCAPNG_OK) {
		(void) pcapng_close( handle );
	}

	return retval;
}